

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

char * jieba_lookup_tag(jieba_t *handle,char *str)

{
  char *pcVar1;
  Jieba *in_RSI;
  string *in_RDI;
  string tag;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,(char *)in_RSI,&local_51);
  cppjieba::Jieba::LookupTag(in_RSI,in_RDI);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = strdup(pcVar1);
  std::__cxx11::string::~string(local_30);
  return pcVar1;
}

Assistant:

char* jieba_lookup_tag(jieba_t* handle, const char* str) {
  std::string tag = ((cppjieba::Jieba*)handle)->LookupTag(str);
  return strdup(tag.c_str());
}